

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

SUNErrCode N_VLinearCombination_Serial(int nvec,sunrealtype *c,N_Vector *X,N_Vector z)

{
  N_Vector x;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  x = *X;
  if (nvec == 2) {
    N_VLinearSum_Serial(*c,x,c[1],X[1],z);
  }
  else if (nvec == 1) {
    N_VScale_Serial(*c,x,z);
  }
  else {
    lVar1 = *z->content;
    lVar2 = *(long *)((long)z->content + 0x10);
    if (x == z) {
      if ((*c != 1.0) || (NAN(*c))) {
        if (0 < lVar1) {
          lVar3 = 0;
          do {
            *(double *)(lVar2 + lVar3 * 8) = *c * *(double *)(lVar2 + lVar3 * 8);
            lVar3 = lVar3 + 1;
          } while (lVar1 != lVar3);
        }
        if (1 < nvec) {
          uVar5 = 1;
          do {
            if (0 < lVar1) {
              lVar3 = *(long *)((long)X[uVar5]->content + 0x10);
              lVar4 = 0;
              do {
                *(double *)(lVar2 + lVar4 * 8) =
                     c[uVar5] * *(double *)(lVar3 + lVar4 * 8) + *(double *)(lVar2 + lVar4 * 8);
                lVar4 = lVar4 + 1;
              } while (lVar1 != lVar4);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != (uint)nvec);
        }
      }
      else if (1 < nvec) {
        uVar5 = 1;
        do {
          if (0 < lVar1) {
            lVar3 = *(long *)((long)X[uVar5]->content + 0x10);
            lVar4 = 0;
            do {
              *(double *)(lVar2 + lVar4 * 8) =
                   c[uVar5] * *(double *)(lVar3 + lVar4 * 8) + *(double *)(lVar2 + lVar4 * 8);
              lVar4 = lVar4 + 1;
            } while (lVar1 != lVar4);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)nvec);
      }
    }
    else {
      if (0 < lVar1) {
        lVar3 = *(long *)((long)x->content + 0x10);
        lVar4 = 0;
        do {
          *(double *)(lVar2 + lVar4 * 8) = *c * *(double *)(lVar3 + lVar4 * 8);
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
      }
      if (1 < nvec) {
        uVar5 = 1;
        do {
          if (0 < lVar1) {
            lVar3 = *(long *)((long)X[uVar5]->content + 0x10);
            lVar4 = 0;
            do {
              *(double *)(lVar2 + lVar4 * 8) =
                   c[uVar5] * *(double *)(lVar3 + lVar4 * 8) + *(double *)(lVar2 + lVar4 * 8);
              lVar4 = lVar4 + 1;
            } while (lVar1 != lVar4);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)nvec);
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VLinearCombination_Serial(int nvec, sunrealtype* c, N_Vector* X,
                                       N_Vector z)
{
  SUNFunctionBegin(X[0]->sunctx);

  int i;
  sunindextype j, N;
  sunrealtype* zd = NULL;
  sunrealtype* xd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VScale */
  if (nvec == 1)
  {
    N_VScale_Serial(c[0], X[0], z);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* should have called N_VLinearSum */
  if (nvec == 2)
  {
    N_VLinearSum_Serial(c[0], X[0], c[1], X[1], z);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  /*
   * X[0] += c[i]*X[i], i = 1,...,nvec-1
   */
  if ((X[0] == z) && (c[0] == ONE))
  {
    for (i = 1; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < N; j++) { zd[j] += c[i] * xd[j]; }
    }
    return SUN_SUCCESS;
  }

  /*
   * X[0] = c[0] * X[0] + sum{ c[i] * X[i] }, i = 1,...,nvec-1
   */
  if (X[0] == z)
  {
    for (j = 0; j < N; j++) { zd[j] *= c[0]; }
    for (i = 1; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < N; j++) { zd[j] += c[i] * xd[j]; }
    }
    return SUN_SUCCESS;
  }

  /*
   * z = sum{ c[i] * X[i] }, i = 0,...,nvec-1
   */
  xd = NV_DATA_S(X[0]);
  for (j = 0; j < N; j++) { zd[j] = c[0] * xd[j]; }
  for (i = 1; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    for (j = 0; j < N; j++) { zd[j] += c[i] * xd[j]; }
  }
  return SUN_SUCCESS;
}